

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

void elf_initoutput(GlobalVars *gv,uint32_t init_file_offset,int8_t output_endianess)

{
  Phdr *pPVar1;
  unsigned_long uVar2;
  int8_t in_DL;
  uint32_t in_ESI;
  GlobalVars *in_RDI;
  Phdr *p;
  undefined3 in_stack_fffffffffffffff0;
  
  elf_file_hdr_gap = 0;
  elf_endianess = in_DL;
  elfoffset = in_ESI;
  if (in_RDI->phdrlist == (Phdr *)0x0) {
    pPVar1 = (Phdr *)alloczero(CONCAT44(in_ESI,CONCAT13(in_DL,in_stack_fffffffffffffff0)));
    pPVar1->name = " dummy";
    pPVar1->type = 1;
    pPVar1->flags = 0x17;
    pPVar1->file_end = 0xffffffff;
    pPVar1->mem_end = 0xffffffff;
    uVar2 = (*fff[in_RDI->dest_format]->headersize)(in_RDI);
    pPVar1->offset = uVar2;
    in_RDI->phdrlist = pPVar1;
  }
  initlist(&shdrlist);
  initlist(&phdrlist);
  elfshdridx = 0;
  elfsymtabidx = elf_addshdrstr((char *)0x1287db);
  elfstrtabidx = elf_addshdrstr((char *)0x1287ed);
  elfshstrtabidx = elf_addshdrstr((char *)0x1287ff);
  return;
}

Assistant:

void elf_initoutput(struct GlobalVars *gv,
                    uint32_t init_file_offset,int8_t output_endianess)
/* initialize section header, program header, relocation, symbol, */
/* string and section header string lists */
{
  elf_endianess = output_endianess;
  elfoffset = init_file_offset;
  elf_file_hdr_gap = 0;

  if (gv->phdrlist == NULL) {
    /* we need to provide at least one dummy PHDR, even for reloc-objects */
    struct Phdr *p = alloczero(sizeof(struct Phdr));

    p->name = " dummy";
    p->type = PT_LOAD;
    p->flags = PF_X|PF_W|PF_R|PHDR_USED;
    p->mem_end = p->file_end = 0xffffffff;
    p->offset = fff[gv->dest_format]->headersize(gv);
    gv->phdrlist = p;
  }

  initlist(&shdrlist);
  initlist(&phdrlist);
  elfshdridx = 0;

  elfsymtabidx = elf_addshdrstr(".symtab");
  elfstrtabidx = elf_addshdrstr(".strtab");
  elfshstrtabidx = elf_addshdrstr(".shstrtab");
}